

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_init_destroy_context_Test::TestBody(cubeb_init_destroy_context_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char *backend_id;
  cubeb *ctx;
  int r;
  cubeb *in_stack_ffffffffffffff48;
  AssertionResult *in_stack_ffffffffffffff50;
  cubeb **in_stack_ffffffffffffff58;
  cubeb **in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff80;
  AssertionResult local_60;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar3;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  AssertHelper *in_stack_ffffffffffffffd0;
  
  common_init(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  uVar4 = 0;
  testing::internal::EqHelper::
  Compare<int,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_mozilla[P]cubeb_include_cubeb_cubeb_h:300:1),_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (char *)in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,
             (anon_enum_32 *)in_stack_ffffffffffffff50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff80._M_head_impl);
    testing::AssertionResult::failure_message((AssertionResult *)0x10d8cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff80._M_head_impl,in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,(char *)in_stack_ffffffffffffff60
              );
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffffd0,(Message *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
    testing::Message::~Message((Message *)0x10d90d);
  }
  uVar3 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d92c);
  if (uVar3 == 0) {
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (void **)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80._M_head_impl);
      testing::AssertionResult::failure_message((AssertionResult *)0x10d98f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_ffffffffffffff80._M_head_impl,in_stack_ffffffffffffff7c,
                 in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                 (char *)in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,(Message *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0x10d9d0);
    }
    uVar3 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10d9ec);
    if (uVar3 == 0) {
      pcVar2 = cubeb_get_backend_id(in_stack_ffffffffffffff48);
      testing::AssertionResult::AssertionResult<char_const*>
                (in_stack_ffffffffffffff50,(char **)in_stack_ffffffffffffff48,(type *)0x10da26);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xffffffffffffff78);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_ffffffffffffff80._M_head_impl);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT44(uVar4,in_stack_ffffffffffffffc8),
                   in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (char *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_ffffffffffffff80._M_head_impl,in_stack_ffffffffffffff7c,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                   (char *)in_stack_ffffffffffffff60);
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffffd0,(Message *)CONCAT44(uVar4,in_stack_ffffffffffffffc8));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
        testing::Message::~Message((Message *)0x10dab8);
      }
      uVar3 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10dad4);
      if (uVar3 == 0) {
        fprintf(_stderr,"Backend: %s\n",pcVar2);
        cubeb_destroy((cubeb *)0x10db0d);
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, init_destroy_context)
{
  int r;
  cubeb * ctx;
  char const * backend_id;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  backend_id = cubeb_get_backend_id(ctx);
  ASSERT_TRUE(backend_id);

  fprintf(stderr, "Backend: %s\n", backend_id);

  cubeb_destroy(ctx);
}